

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.cpp
# Opt level: O2

char * luaF_getlocalname(Proto *f,int local_number,int pc)

{
  LocVar *pLVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = (ulong)(uint)f->sizelocvars;
  if (f->sizelocvars < 1) {
    uVar2 = 0;
  }
  lVar3 = 0;
  while( true ) {
    if (uVar2 * 0x10 == lVar3) {
      return (char *)0x0;
    }
    pLVar1 = f->locvars;
    if (pc < *(int *)((long)&pLVar1->startpc + lVar3)) break;
    if ((pc < *(int *)((long)&pLVar1->endpc + lVar3)) &&
       (local_number = local_number + -1, local_number == 0)) {
      return (char *)(*(long *)((long)&pLVar1->varname + lVar3) + 0x18);
    }
    lVar3 = lVar3 + 0x10;
  }
  return (char *)0x0;
}

Assistant:

const char *luaF_getlocalname (const Proto *f, int local_number, int pc) {
  int i;
  for (i = 0; i<f->sizelocvars && f->locvars[i].startpc <= pc; i++) {
    if (pc < f->locvars[i].endpc) {  /* is variable active? */
      local_number--;
      if (local_number == 0)
        return getstr(f->locvars[i].varname);
    }
  }
  return NULL;  /* not found */
}